

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int pk_use_ecparams(mbedtls_asn1_buf *params,mbedtls_pk_context_conflict *pk)

{
  int iVar1;
  mbedtls_pk_type_t mVar2;
  int iVar3;
  mbedtls_ecp_group *grp;
  mbedtls_pk_context_conflict local_38;
  mbedtls_ecp_group_id local_1c [2];
  mbedtls_ecp_group_id grp_id;
  
  iVar3 = -0x3d00;
  if (params->tag == 6) {
    iVar1 = mbedtls_oid_get_ec_grp(params,local_1c);
    iVar3 = -0x3a00;
    if (iVar1 == 0) {
      local_38.priv_id = pk->priv_id;
      local_38._20_4_ = *(undefined4 *)&pk->field_0x14;
      local_38.pk_info = pk->pk_info;
      local_38.pk_ctx = pk->pk_ctx;
      mbedtls_pk_get_type(&local_38);
      if (*local_38.pk_ctx != 0) {
        local_38.priv_id = pk->priv_id;
        local_38._20_4_ = *(undefined4 *)&pk->field_0x14;
        local_38.pk_info = pk->pk_info;
        local_38.pk_ctx = pk->pk_ctx;
        mbedtls_pk_get_type(&local_38);
        if (*local_38.pk_ctx != local_1c[0]) {
          return -0x3d00;
        }
      }
      local_38.priv_id = pk->priv_id;
      local_38._20_4_ = *(undefined4 *)&pk->field_0x14;
      local_38.pk_info = pk->pk_info;
      local_38.pk_ctx = pk->pk_ctx;
      mVar2 = mbedtls_pk_get_type(&local_38);
      grp = (mbedtls_ecp_group *)local_38.pk_ctx;
      if (2 < mVar2 - MBEDTLS_PK_ECKEY) {
        grp = (mbedtls_ecp_group *)0x0;
      }
      iVar3 = mbedtls_ecp_group_load(grp,local_1c[0]);
    }
  }
  return iVar3;
}

Assistant:

static int pk_use_ecparams(const mbedtls_asn1_buf *params, mbedtls_pk_context *pk)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_group_id grp_id;

    if (params->tag == MBEDTLS_ASN1_OID) {
        if (mbedtls_oid_get_ec_grp(params, &grp_id) != 0) {
            return MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE;
        }
    } else {
#if defined(MBEDTLS_PK_PARSE_EC_EXTENDED)
        if ((ret = pk_group_id_from_specified(params, &grp_id)) != 0) {
            return ret;
        }
#else
        return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
#endif
    }

#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    ret = pk_update_psa_ecparams(pk, grp_id);
#else
    /* grp may already be initialized; if so, make sure IDs match */
    if (mbedtls_pk_ec_ro(*pk)->grp.id != MBEDTLS_ECP_DP_NONE &&
        mbedtls_pk_ec_ro(*pk)->grp.id != grp_id) {
        return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
    }

    if ((ret = mbedtls_ecp_group_load(&(mbedtls_pk_ec_rw(*pk)->grp),
                                      grp_id)) != 0) {
        return ret;
    }
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */

    return ret;
}